

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::setAttributes
          (Compilation *this,PortConnection *conn,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes)

{
  flat_hash_map<const_void_*,_std::span<const_AttributeSymbol_*const>_> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  value_type_pointer ppVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  ulong pos0;
  ulong uVar7;
  ulong hash;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  locator res;
  try_emplace_args_t local_71;
  pointer local_70;
  PortConnection *local_68;
  ulong local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  local_70 = attributes._M_ptr;
  arrays_ = &this->attributeMap;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = conn;
  hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->attributeMap).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar4 = (this->attributeMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
           .arrays.elements_;
  local_60 = (this->attributeMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
             .arrays.groups_size_mask;
  uVar7 = 0;
  uVar10 = pos0;
  do {
    pgVar2 = (this->attributeMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
             .arrays.groups_ + uVar10;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bStack_49 = pgVar2->m[0xf].n;
    uVar11 = (uchar)uVar3;
    auVar15[0] = -(local_58 == uVar11);
    uVar12 = (uchar)((uint)uVar3 >> 8);
    auVar15[1] = -(uStack_57 == uVar12);
    uVar13 = (uchar)((uint)uVar3 >> 0x10);
    auVar15[2] = -(uStack_56 == uVar13);
    bVar14 = (byte)((uint)uVar3 >> 0x18);
    auVar15[3] = -(bStack_55 == bVar14);
    auVar15[4] = -(uStack_54 == uVar11);
    auVar15[5] = -(uStack_53 == uVar12);
    auVar15[6] = -(uStack_52 == uVar13);
    auVar15[7] = -(bStack_51 == bVar14);
    auVar15[8] = -(uStack_50 == uVar11);
    auVar15[9] = -(uStack_4f == uVar12);
    auVar15[10] = -(uStack_4e == uVar13);
    auVar15[0xb] = -(bStack_4d == bVar14);
    auVar15[0xc] = -(uStack_4c == uVar11);
    auVar15[0xd] = -(uStack_4b == uVar12);
    auVar15[0xe] = -(uStack_4a == uVar13);
    auVar15[0xf] = -(bStack_49 == bVar14);
    for (uVar8 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe); uVar8 != 0;
        uVar8 = uVar8 - 1 & uVar8) {
      uVar5 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      if ((PortConnection *)ppVar4[uVar10 * 0xf + (ulong)uVar5].first == conn) {
        local_48.p = ppVar4 + uVar10 * 0xf + (ulong)uVar5;
        goto LAB_0080ff6f;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_49) == 0) break;
    lVar9 = uVar10 + uVar7;
    uVar7 = uVar7 + 1;
    uVar10 = lVar9 + 1U & local_60;
  } while (uVar7 <= local_60);
  local_68 = conn;
  if ((this->attributeMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
      .size_ctrl.size <
      (this->attributeMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
    ::nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,void_const*>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
                *)arrays_,(arrays_type *)arrays_,pos0,hash,&local_71,&local_68);
    psVar1 = &(this->attributeMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
    ::unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,void_const*>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
                *)arrays_,hash,&local_71,&local_68);
  }
LAB_0080ff6f:
  ((local_48.p)->second)._M_ptr = local_70;
  ((local_48.p)->second)._M_extent._M_extent_value =
       attributes._M_extent._M_extent_value._M_extent_value;
  return;
}

Assistant:

void Compilation::setAttributes(const PortConnection& conn,
                                std::span<const AttributeSymbol* const> attributes) {
    attributeMap[&conn] = attributes;
}